

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

int64_t util::parse_bounded(char *s,int64_t min,int64_t max)

{
  int64_t iVar1;
  invalid_argument *this;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = parse(s);
  if ((min <= iVar1) && (iVar1 <= max)) {
    return iVar1;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_c0,min);
  std::operator+(&local_a0,"parsed value outside given range [",&local_c0);
  std::operator+(&local_80,&local_a0,"; ");
  std::__cxx11::to_string(&local_e0,max);
  std::operator+(&local_60,&local_80,&local_e0);
  std::operator+(&local_40,&local_60,"]");
  std::invalid_argument::invalid_argument(this,(string *)&local_40);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::int64_t parse_bounded(const char* s,
		std::int64_t min = std::numeric_limits<std::int64_t>::min(),
		std::int64_t max = std::numeric_limits<std::int64_t>::max())
{
	std::int64_t value = parse(s);
	if (value < min || value > max)
	{
		throw std::invalid_argument(std::string("parsed value outside given "
			"range [" + std::to_string(min) + "; " + std::to_string(max) + "]"));
	}

	return value;
}